

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

void __thiscall
ExternalFixupMembersImport_Addend_Test::TestBody(ExternalFixupMembersImport_Addend_Test *this)

{
  database *db;
  ulong uVar1;
  tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  error_code eVar4;
  mock_mutex mutex;
  external_fixup_collection fixups;
  string_mapping imported_names;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  AssertHelper local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  undefined1 local_1e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  mutex_type local_1b9;
  error_code local_1b8;
  long local_1a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a0;
  AssertHelper local_198;
  not_null<pstore::transaction_base_*> local_190;
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  error_code local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  not_null<external_fixup_collection_*> local_e0;
  string_mapping local_d8;
  transaction<std::unique_lock<mock_mutex>_> local_58;
  
  db = &(this->super_ExternalFixupMembersImport).db_;
  local_188 = (undefined1  [8])&local_1b9;
  local_180[0] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_188);
  local_180[0] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_58,db,(unique_lock<mock_mutex> *)local_188);
  local_d8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d8.strings_;
  local_d8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_d8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_d8.views_;
  local_d8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_d8.lookup_._M_h._M_buckets = &local_d8.lookup_._M_h._M_single_bucket;
  local_d8.lookup_._M_h._M_bucket_count = 1;
  local_d8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.lookup_._M_h._M_element_count = 0;
  local_d8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_190.ptr_ = &local_58.super_transaction_base;
  local_d8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_d8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_d8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_d8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_190);
  local_188 = (undefined1  [8])(local_180 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"name","");
  eVar4 = pstore::exchange::import_ns::string_mapping::add_string
                    (&local_d8,(not_null<transaction_base_*>)local_190.ptr_,(string *)local_188);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar4._M_cat;
  local_1e0._0_4_ = eVar4._M_value;
  local_1b8._0_8_ = (ulong)(uint)local_1b8._4_4_ << 0x20;
  local_1b8._M_cat = (error_category *)std::_V2::system_category();
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_210,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",(error_code *)local_1e0,&local_1b8);
  if (local_188 != (undefined1  [8])(local_180 + 8)) {
    operator_delete((void *)local_188,local_178[0]._M_allocated_capacity + 1);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_188);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x24f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1e0,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e0);
    if (local_188 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_188 + 8))();
    }
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
  }
  else {
    if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,local_208);
    }
    local_1b8._0_8_ =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    local_1b8._M_cat = (error_category *)0x0;
    local_1a8 = 0;
    local_210 = (undefined1  [8])&local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"{ \"name\":0, \"type\":17, \"offset\":19 }","");
    local_e0.ptr_ =
         (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
         &local_1b8;
    pstore::gsl::
    not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
    ::ensure_invariant(&local_e0);
    anon_unknown.dwarf_431e0c::ExternalFixupMembersImport::parse
              ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_210,db,
               &local_d8,local_e0);
    if (local_210 != (undefined1  [8])&local_200) {
      operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
    }
    local_1f0.data_._0_4_ = CONCAT31(local_1f0.data_._1_3_,local_130._M_value == 0);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_130._M_value != 0) {
      testing::Message::Message((Message *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0._M_head_impl + 0x10),"JSON error was: ",0x10);
      (**(code **)(*(long *)local_130._M_cat + 0x20))(local_210,local_130._M_cat,local_130._M_value)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a0._M_head_impl + 0x10),(char *)local_210,(long)local_208);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1e0,(internal *)&local_1f0,
                 (AssertionResult *)"parser1.has_error ()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x256,(char *)local_1e0);
      testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      if (local_1e0 != (undefined1  [8])&local_1d0) {
        operator_delete((void *)local_1e0,local_1d0._M_allocated_capacity + 1);
      }
      if (local_210 != (undefined1  [8])&local_200) {
        operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
      }
      if (local_1a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1a0._M_head_impl + 8))();
      }
      if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e8,local_1e8);
      }
    }
    local_1e0 = (undefined1  [8])((long)local_1b8._M_cat - local_1b8._0_8_ >> 5);
    local_1f0.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)local_210,"fixups.size ()","1U",(unsigned_long *)local_1e0,
               (uint *)&local_1f0);
    if (local_210[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1e0);
      if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_208->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,600,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f0,(Message *)local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      if (local_1e0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1e0 + 8))();
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)local_180);
      if (local_188 != (undefined1  [8])0x0) {
        operator_delete((void *)local_188,0x68);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_1b8._0_8_ ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0018215f;
      uVar1 = local_1a8 - local_1b8._0_8_;
      tVar2.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_1b8._0_8_;
    }
    else {
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      local_1e0 = (undefined1  [8])((ulong)local_1e0 & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)local_210,"fixups[0].addend","0",(long *)(local_1b8._0_8_ + 0x18),
                 (int *)local_1e0);
      if (local_210[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1e0);
        if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_208->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x259,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,(Message *)local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        if (local_1e0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1e0 + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)local_180);
      if (local_188 != (undefined1  [8])0x0) {
        operator_delete((void *)local_188,0x68);
      }
      if ((mutex_type *)local_1b8._0_8_ != (mutex_type *)0x0) {
        operator_delete((void *)local_1b8._0_8_,local_1a8 - local_1b8._0_8_);
      }
      local_210 = (undefined1  [8])&local_200;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":true }",
                 "");
      anon_unknown.dwarf_431e0c::ExternalFixupMembersImport::parse
                ((parser<pstore::exchange::import_ns::callbacks> *)local_188,(string *)local_210,db,
                 &local_d8);
      if (local_210 != (undefined1  [8])&local_200) {
        operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
      }
      local_1e0[0] = local_130._M_value != 0;
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_130._M_value == 0) {
        testing::Message::Message((Message *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8._0_8_ + 0x10),"Expected the parse to fail",0x1a);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_210,(internal *)local_1e0,
                   (AssertionResult *)"parser2.has_error ()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x25f,(char *)local_210);
        testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        if (local_210 != (undefined1  [8])&local_200) {
          operator_delete((void *)local_210,local_200._M_allocated_capacity + 1);
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1b8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1b8._0_8_ + 8))();
        }
        if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1d8,local_1d8);
        }
      }
      eVar4 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)eVar4._M_cat;
      local_1e0._0_4_ = eVar4._M_value;
      testing::internal::CmpHelperEQ<std::error_code,std::error_code>
                ((internal *)local_210,"parser2.last_error ()",
                 "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",
                 &local_130,(error_code *)local_1e0);
      if (local_210[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_1e0);
        if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_208->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x261,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b8,(Message *)local_1e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b8);
        if (local_1e0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_1e0 + 8))();
        }
      }
      if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208,local_208);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
      ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
                *)local_180);
      if (local_188 == (undefined1  [8])0x0) goto LAB_0018215f;
      uVar1 = 0x68;
      tVar2.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )local_188;
    }
    operator_delete((void *)tVar2.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,uVar1);
  }
LAB_0018215f:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_d8);
  local_58.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00234578;
  pstore::transaction_base::rollback(&local_58.super_transaction_base);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Addend) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});
    pstore::exchange::import_ns::string_mapping imported_names;
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The "addend" key is missing altogether. That's okay: the default is 0.
    {
        external_fixup_collection fixups;
        auto const parser1 =
            this->parse (R"({ "name":0, "type":17, "offset":19 })", &db_, imported_names, &fixups);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
        ASSERT_EQ (fixups.size (), 1U);
        EXPECT_EQ (fixups[0].addend, 0);
    }
    // The "addend" key has the wrong type.
    {
        auto const parser2 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":true })",
                                          &db_, imported_names);
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}